

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gds2writer.cpp
# Opt level: O0

void __thiscall GDS2Writer::~GDS2Writer(GDS2Writer *this)

{
  GDS2Writer *this_local;
  
  this->_vptr_GDS2Writer = (_func_int **)&PTR__GDS2Writer_001a3d08;
  writeEpilog(this);
  fclose((FILE *)this->m_fout);
  doLog(1,"GDS2Writer destroyed\n");
  std::__cxx11::string::~string((string *)&this->m_designName);
  return;
}

Assistant:

GDS2Writer::~GDS2Writer()
{
    writeEpilog();
    fclose(m_fout);
    doLog(LOG_VERBOSE,"GDS2Writer destroyed\n");
}